

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,OneHotEncoder *from)

{
  ulong uVar1;
  undefined3 uVar2;
  int iVar3;
  Int64Vector *this_00;
  StringVector *this_01;
  undefined1 *puVar4;
  Arena *pAVar5;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__OneHotEncoder_0048e660;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  uVar2 = *(undefined3 *)&from->field_0x11;
  iVar3 = from->handleunknown_;
  this->outputsparse_ = from->outputsparse_;
  *(undefined3 *)&this->field_0x11 = uVar2;
  this->handleunknown_ = iVar3;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    clear_CategoryType(this);
    this->_oneof_case_[0] = 1;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (pAVar5);
    (this->CategoryType_).stringcategories_ = this_01;
    if (from->_oneof_case_[0] == 1) {
      puVar4 = (undefined1 *)(from->CategoryType_).stringcategories_;
    }
    else {
      puVar4 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar4);
  }
  else if (from->_oneof_case_[0] == 2) {
    clear_CategoryType(this);
    this->_oneof_case_[0] = 2;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar5 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar5 = *(Arena **)pAVar5;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                        (pAVar5);
    (this->CategoryType_).int64categories_ = this_00;
    if (from->_oneof_case_[0] == 2) {
      puVar4 = (undefined1 *)(from->CategoryType_).int64categories_;
    }
    else {
      puVar4 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_00,(Int64Vector *)puVar4);
  }
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const OneHotEncoder& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&outputsparse_, &from.outputsparse_,
    static_cast<size_t>(reinterpret_cast<char*>(&handleunknown_) -
    reinterpret_cast<char*>(&outputsparse_)) + sizeof(handleunknown_));
  clear_has_CategoryType();
  switch (from.CategoryType_case()) {
    case kStringCategories: {
      _internal_mutable_stringcategories()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringcategories());
      break;
    }
    case kInt64Categories: {
      _internal_mutable_int64categories()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64categories());
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.OneHotEncoder)
}